

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsubwins.cpp
# Opt level: O3

int main(void)

{
  init_windows();
  draw_strings();
  test_reparent1();
  printf("Hit RETURN to exit:");
  getchar();
  return 0;
}

Assistant:

int
main()
{
  init_windows();
  draw_strings();

  test_reparent1();

  ///
  ///  Exit
  ///
  printf("Hit RETURN to exit:");
  getchar();

  return 0;
}